

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall
wasm::DataFlow::Graph::mergeBlock
          (Graph *this,
          vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
          *localses,Locals *out)

{
  bool bVar1;
  Graph *local_60;
  reference local_58;
  vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *locals;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
  *__range2;
  vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_> states
  ;
  Locals *out_local;
  vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
  *localses_local;
  Graph *this_local;
  
  states.
  super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)out;
  std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>::
  vector((vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
          *)&__range2);
  __end2 = std::
           vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
           ::begin(localses);
  locals = (vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)
           std::
           vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
           ::end(localses);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_*,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>
                                *)&locals);
    if (!bVar1) break;
    local_58 = __gnu_cxx::
               __normal_iterator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_*,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>
               ::operator*(&__end2);
    local_60 = this;
    std::vector<wasm::DataFlow::Graph::FlowState,std::allocator<wasm::DataFlow::Graph::FlowState>>::
    emplace_back<std::vector<wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>>&,wasm::DataFlow::Node*>
              ((vector<wasm::DataFlow::Graph::FlowState,std::allocator<wasm::DataFlow::Graph::FlowState>>
                *)&__range2,local_58,(Node **)&local_60);
    __gnu_cxx::
    __normal_iterator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_*,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>
    ::operator++(&__end2);
  }
  merge(this,(vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
              *)&__range2,
        &(states.
          super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage)->locals);
  std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>::
  ~vector((vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
           *)&__range2);
  return;
}

Assistant:

void mergeBlock(std::vector<Locals>& localses, Locals& out) {
    // TODO: conditions
    std::vector<FlowState> states;
    for (auto& locals : localses) {
      states.emplace_back(locals, &bad);
    }
    merge(states, out);
  }